

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopFromTruthBin(char *pTruth)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  Vec_Int_t *p;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  sVar3 = strlen(pTruth);
  uVar13 = (uint)sVar3;
  uVar6 = sVar3 & 0xffffffff;
  if (1 < uVar13) {
    uVar2 = uVar13 - 1;
    if (uVar2 == 0) {
      uVar6 = 0;
    }
    else {
      uVar7 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar6 = (ulong)((uVar7 ^ 0xffffffe0) + 0x21);
    }
  }
  if (1 << ((byte)uVar6 & 0x1f) == uVar13) {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar4 = (int *)malloc(400);
    p->pArray = piVar4;
    if (0 < (int)uVar13) {
      uVar8 = 0;
      uVar2 = uVar13;
      do {
        uVar2 = uVar2 - 1;
        if ((pTruth[uVar8] & 0xfeU) != 0x30) {
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
            p->pArray = (int *)0x0;
          }
          free(p);
          printf("String %s does not look like a binary representation of the truth table.\n",pTruth
                );
          return (char *)0x0;
        }
        if (pTruth[uVar8] == 0x31) {
          Vec_IntPush(p,uVar2);
        }
        uVar8 = uVar8 + 1;
      } while ((uVar13 & 0x7fffffff) != uVar8);
    }
    uVar2 = p->nSize;
    if (uVar2 == 0 || uVar2 == uVar13) {
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      puts("Cannot create constant function.");
      pcVar5 = (char *)0x0;
    }
    else {
      uVar13 = (uint)uVar6;
      uVar7 = uVar13 + 3;
      pcVar5 = (char *)malloc((long)(int)(uVar2 * uVar7 + 1));
      pcVar5[(int)(uVar2 * uVar7)] = '\0';
      if (0 < (int)uVar2) {
        piVar4 = p->pArray;
        uVar8 = 0;
        pcVar9 = pcVar5;
        do {
          if (uVar13 != 0) {
            uVar1 = piVar4[uVar8];
            uVar12 = 0;
            uVar11 = uVar13;
            do {
              uVar11 = uVar11 - 1;
              pcVar9[uVar12] = (uVar1 >> (uVar11 & 0x1f) & 1) == 0 ^ 0x31;
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
          lVar10 = uVar8 * uVar7;
          (pcVar5 + uVar6 + lVar10)[0] = ' ';
          (pcVar5 + uVar6 + lVar10)[1] = '1';
          pcVar5[uVar6 + lVar10 + 2] = '\n';
          uVar8 = uVar8 + 1;
          pcVar9 = pcVar9 + uVar7;
        } while (uVar8 != uVar2);
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
    }
  }
  else {
    pcVar5 = (char *)0x0;
    printf("String %s does not look like a truth table of a %d-variable function.\n",pTruth,uVar6);
  }
  return pcVar5;
}

Assistant:

char * Abc_SopFromTruthBin( char * pTruth )
{
    char * pSopCover, * pCube;
    int nTruthSize, nVars, Digit, Length, Mint, i, b;
    Vec_Int_t * vMints;

    // get the number of variables
    nTruthSize = strlen(pTruth);
    nVars = Abc_Base2Log( nTruthSize );
    if ( nTruthSize != (1 << (nVars)) )
    {
        printf( "String %s does not look like a truth table of a %d-variable function.\n", pTruth, nVars );
        return NULL;
    }

    // collect the on-set minterms
    vMints = Vec_IntAlloc( 100 );
    for ( i = 0; i < nTruthSize; i++ )
    {
        if ( pTruth[i] >= '0' && pTruth[i] <= '1' )
            Digit = pTruth[i] - '0';
        else
        {
            Vec_IntFree( vMints );
            printf( "String %s does not look like a binary representation of the truth table.\n", pTruth );
            return NULL;
        }
        if ( Digit == 1 )
            Vec_IntPush( vMints, nTruthSize - 1 - i );
    }
    if ( Vec_IntSize( vMints ) == 0 || Vec_IntSize( vMints ) == nTruthSize )
    {
        Vec_IntFree( vMints );
        printf( "Cannot create constant function.\n" );
        return NULL;
    }

    // create the SOP representation of the minterms
    Length = Vec_IntSize(vMints) * (nVars + 3);
    pSopCover = ABC_ALLOC( char, Length + 1 );
    pSopCover[Length] = 0;
    Vec_IntForEachEntry( vMints, Mint, i )
    {
        pCube = pSopCover + i * (nVars + 3);
        for ( b = 0; b < nVars; b++ )
            if ( Mint & (1 << (nVars-1-b)) )
//            if ( Mint & (1 << b) )
                pCube[b] = '1';
            else
                pCube[b] = '0';
        pCube[nVars + 0] = ' ';
        pCube[nVars + 1] = '1';
        pCube[nVars + 2] = '\n';
    }
    Vec_IntFree( vMints );
    return pSopCover;
}